

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

StringTree * capnp::compiler::stringLiteral(StringTree *__return_storage_ptr__,StringPtr chars)

{
  size_t in_RCX;
  char *in_R8;
  ArrayPtr<const_char> text;
  undefined1 local_51 [9];
  char *local_48;
  String local_40;
  kj local_21;
  undefined1 local_20 [8];
  StringPtr chars_local;
  
  chars_local.content.ptr = (char *)chars.content.size_;
  local_20 = (undefined1  [8])chars.content.ptr;
  local_21 = (kj)0x22;
  chars_local.content.size_ = (size_t)__return_storage_ptr__;
  join_0x00000010_0x00000000_ = kj::StringPtr::operator_cast_to_ArrayPtr((StringPtr *)local_20);
  text.size_ = in_RCX;
  text.ptr = local_48;
  kj::encodeCEscape(&local_40,(kj *)local_51._1_8_,text);
  local_51[0] = 0x22;
  kj::strTree<char,kj::String,char>
            (__return_storage_ptr__,&local_21,(char *)&local_40,(String *)local_51,in_R8);
  kj::String::~String(&local_40);
  return __return_storage_ptr__;
}

Assistant:

static kj::StringTree stringLiteral(kj::StringPtr chars) {
  return kj::strTree('"', kj::encodeCEscape(chars), '"');
}